

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O3

char * __thiscall google::protobuf::internal::MicroString::LargeRep::owned_head(LargeRep *this)

{
  if (2 < this->capacity) {
    return (char *)(this + 1);
  }
  owned_head();
}

Assistant:

char* owned_head() {
      ABSL_DCHECK_GE(capacity, kOwned);
      return reinterpret_cast<char*>(this + 1);
    }